

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

void duckdb::BinaryExecutor::
     ExecuteConstant<duckdb::string_t,duckdb::string_t,bool,duckdb::BinaryStandardOperatorWrapper,duckdb::StartsWithOperator,bool>
               (Vector *left,Vector *right,Vector *result,bool fun)

{
  string_t right_00;
  string_t left_00;
  byte bVar1;
  bool bVar2;
  string_t *psVar3;
  string_t *psVar4;
  bool *pbVar5;
  byte in_CL;
  Vector *in_RDX;
  idx_t in_RSI;
  bool *result_data;
  string_t *rdata;
  string_t *ldata;
  ValidityMask *mask;
  undefined1 fun_00;
  undefined7 in_stack_ffffffffffffffe0;
  
  bVar1 = in_CL & 1;
  duckdb::Vector::SetVectorType((VectorType)in_RDX);
  psVar3 = ConstantVector::GetData<duckdb::string_t>((Vector *)0xee2844);
  psVar4 = ConstantVector::GetData<duckdb::string_t>((Vector *)0xee2853);
  pbVar5 = ConstantVector::GetData<bool>((Vector *)0xee2862);
  bVar2 = ConstantVector::IsNull((Vector *)0xee2871);
  if ((!bVar2) && (bVar2 = ConstantVector::IsNull((Vector *)0xee287f), !bVar2)) {
    mask = *(ValidityMask **)&psVar3->value;
    fun_00 = (undefined1)((ulong)*(undefined8 *)((long)&psVar3->value + 8) >> 0x38);
    ConstantVector::Validity(in_RDX);
    left_00.value._8_7_ = in_stack_ffffffffffffffe0;
    left_00.value._0_8_ = psVar3;
    left_00.value.inlined.inlined[0xb] = bVar1;
    right_00.value.pointer.ptr = (char *)psVar4;
    right_00.value._0_8_ = pbVar5;
    bVar2 = BinaryStandardOperatorWrapper::
            Operation<bool,duckdb::StartsWithOperator,duckdb::string_t,duckdb::string_t,bool>
                      ((bool)fun_00,left_00,right_00,mask,in_RSI);
    *pbVar5 = bVar2;
    return;
  }
  duckdb::ConstantVector::SetNull(in_RDX,true);
  return;
}

Assistant:

static void ExecuteConstant(Vector &left, Vector &right, Vector &result, FUNC fun) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);

		auto ldata = ConstantVector::GetData<LEFT_TYPE>(left);
		auto rdata = ConstantVector::GetData<RIGHT_TYPE>(right);
		auto result_data = ConstantVector::GetData<RESULT_TYPE>(result);

		if (ConstantVector::IsNull(left) || ConstantVector::IsNull(right)) {
			ConstantVector::SetNull(result, true);
			return;
		}
		*result_data = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
		    fun, *ldata, *rdata, ConstantVector::Validity(result), 0);
	}